

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

uint8_t * __thiscall
google::protobuf::internal::ExtensionSet::InternalSerializeMessageSetWithCachedSizesToArray
          (ExtensionSet *this,MessageLite *extendee,uint8_t *target,EpsCopyOutputStream *stream)

{
  ExtensionSet *extension_set;
  EpsCopyOutputStream *stream_local;
  uint8_t *target_local;
  MessageLite *extendee_local;
  ExtensionSet *this_local;
  
  ForEach<google::protobuf::internal::ExtensionSet::InternalSerializeMessageSetWithCachedSizesToArray(google::protobuf::MessageLite_const*,unsigned_char*,google::protobuf::io::EpsCopyOutputStream*)const::__0,google::protobuf::internal::ExtensionSet::Prefetch>
            ();
  return target;
}

Assistant:

uint8_t* ExtensionSet::InternalSerializeMessageSetWithCachedSizesToArray(
    const MessageLite* extendee, uint8_t* target,
    io::EpsCopyOutputStream* stream) const {
  const ExtensionSet* extension_set = this;
  ForEach(
      [&target, extendee, stream, extension_set](int number,
                                                 const Extension& ext) {
        target = ext.InternalSerializeMessageSetItemWithCachedSizesToArray(
            extendee, extension_set, number, target, stream);
      },
      Prefetch{});
  return target;
}